

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

SubControl __thiscall QToolButtonPrivate::newHoverControl(QToolButtonPrivate *this,QPoint *pos)

{
  QWidget *this_00;
  int iVar1;
  QStyle *pQVar2;
  SubControl SVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QStyleOptionToolButton opt;
  QStyleOptionToolButton local_c0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  memset(&local_c0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton(&local_c0);
  (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&local_c0);
  local_c0.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar2 = QWidget::style(this_00);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,4,&local_c0,pos,this_00);
  *(int *)&(this->super_QAbstractButtonPrivate).field_0x2b4 = iVar1;
  if (iVar1 == 0) {
    (this->hoverRect).x1 = 0;
    (this->hoverRect).y1 = 0;
    (this->hoverRect).x2 = -1;
    (this->hoverRect).y2 = -1;
    SVar3 = SC_None;
  }
  else {
    pQVar2 = QWidget::style(this_00);
    QVar4 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))
                             (pQVar2,4,&local_c0,
                              *(undefined4 *)&(this->super_QAbstractButtonPrivate).field_0x2b4,
                              this_00);
    this->hoverRect = QVar4;
    SVar3 = *(SubControl *)&(this->super_QAbstractButtonPrivate).field_0x2b4;
  }
  QFont::~QFont(&local_c0.font);
  if (&(local_c0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_c0.icon);
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QToolButtonPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QToolButton);
    QStyleOptionToolButton opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ToolButton, &opt, pos, q);
    if (hoverControl == QStyle::SC_None)
        hoverRect = QRect();
    else
        hoverRect = q->style()->subControlRect(QStyle::CC_ToolButton, &opt, hoverControl, q);
    return hoverControl;
}